

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::DescriptorBuilder
          (DescriptorBuilder *this,DescriptorPool *pool,Tables *tables,
          ErrorCollector *error_collector)

{
  allocator local_29;
  ErrorCollector *local_28;
  ErrorCollector *error_collector_local;
  Tables *tables_local;
  DescriptorPool *pool_local;
  DescriptorBuilder *this_local;
  
  this->pool_ = pool;
  this->tables_ = tables;
  this->error_collector_ = error_collector;
  local_28 = error_collector;
  error_collector_local = (ErrorCollector *)tables;
  tables_local = (Tables *)pool;
  pool_local = (DescriptorPool *)this;
  std::
  vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ::vector(&this->options_to_interpret_);
  this->had_errors_ = false;
  std::__cxx11::string::string((string *)&this->filename_);
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set(&this->dependencies_);
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set(&this->unused_dependency_);
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  std::__cxx11::string::string((string *)&this->possible_undeclared_dependency_name_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->undefine_resolved_name_,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

DescriptorBuilder::DescriptorBuilder(
    const DescriptorPool* pool, DescriptorPool::Tables* tables,
    DescriptorPool::ErrorCollector* error_collector)
    : pool_(pool),
      tables_(tables),
      error_collector_(error_collector),
      had_errors_(false),
      possible_undeclared_dependency_(nullptr),
      undefine_resolved_name_("") {}